

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_api.c
# Opt level: O2

char * module_file_base(char *module,char sep)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  __s = (*ecs_os_api.strdup_)(module);
  sVar1 = strlen(__s);
  uVar3 = 0;
  uVar2 = sVar1 & 0xffffffff;
  if ((int)sVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if (__s[uVar3] == '.') {
      __s[uVar3] = sep;
    }
  }
  return __s;
}

Assistant:

static
char *module_file_base(const char *module, char sep) {
    char *base = ecs_os_strdup(module);
    ecs_size_t i, len = ecs_os_strlen(base);
    for (i = 0; i < len; i ++) {
        if (base[i] == '.') {
            base[i] = sep;
        }
    }

    return base;
}